

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

unsigned_long TJBUFSIZE(int width,int height)

{
  char *pcVar1;
  
  if (width < 1 || height < 1) {
    pcVar1 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar1,"TJBUFSIZE(): Invalid argument",0x1e);
    return 0xffffffffffffffff;
  }
  return (ulong)((height + 0xfU & 0xffffff0) * (width + 0xfU & 0x7ffffff0)) * 6 + 0x800;
}

Assistant:

DLLEXPORT unsigned long TJBUFSIZE(int width, int height)
{
  unsigned long long retval = 0;

  if (width < 1 || height < 1)
    THROWG("TJBUFSIZE(): Invalid argument");

  /* This allows for rare corner cases in which a JPEG image can actually be
     larger than the uncompressed input (we wouldn't mention it if it hadn't
     happened before.) */
  retval = PAD(width, 16) * PAD(height, 16) * 6ULL + 2048ULL;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("TJBUFSIZE(): Image is too large");

bailout:
  return (unsigned long)retval;
}